

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::GenerateFastLdLen(Lowerer *this,Instr *ldLen,bool *instrIsInHelperBlockRef)

{
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  IRType IVar5;
  BailOutKind BVar6;
  BailOutKind e1;
  undefined4 *puVar7;
  Opnd *pOVar8;
  Opnd *this_00;
  LabelInstr *pLVar9;
  SymOpnd *pSVar10;
  PropertySym *pPVar11;
  StackSym *pSVar12;
  IndirOpnd *pIVar13;
  IntConstOpnd *pIVar14;
  LabelInstr *pLVar15;
  LabelInstr *local_178;
  uint32 local_150;
  bool local_149;
  Opnd *dst32;
  IndirOpnd *indirOpnd_1;
  LabelInstr *labelToVar;
  IndirOpnd *indirOpnd;
  anon_class_24_3_5980dfa8 EnsureLengthOpnd;
  AutoReuseOpnd autoReuseLengthOpnd;
  RegOpnd *lengthOpnd;
  AutoReuseOpnd autoReuseArrayOpnd;
  ArrayRegOpnd *arrayRegOpnd;
  undefined1 local_a8 [8];
  AutoReuseOpnd autoReuseArrayLengthOpnd;
  RegOpnd *arrayLengthOpnd;
  RegOpnd *arrayOpnd;
  LabelInstr *labelString;
  int32 arrayOffsetOfLength;
  PropertySym *propertySym;
  SymOpnd *symOpnd;
  RegOpnd *src;
  bool stringFastPath;
  bool arrayFastPath;
  LabelInstr *labelHelper;
  RegOpnd *pRStack_40;
  ValueType srcValueType;
  RegOpnd *dst;
  Opnd *opnd;
  bool *instrIsInHelperBlock;
  bool *instrIsInHelperBlockRef_local;
  Instr *ldLen_local;
  Lowerer *this_local;
  
  if (instrIsInHelperBlockRef == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4c1b,"(instrIsInHelperBlockRef)","instrIsInHelperBlockRef");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  *instrIsInHelperBlockRef = false;
  pOVar8 = IR::Instr::GetSrc1(ldLen);
  this_00 = IR::Instr::GetDst(ldLen);
  pRStack_40 = IR::Opnd::AsRegOpnd(this_00);
  labelHelper._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(pOVar8);
  pLVar9 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = IR::Instr::DoStackArgsOpt(ldLen);
  if (bVar3) {
    pLVar9 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    GenerateFastArgumentsLdLen(this,ldLen,pLVar9);
    IR::Instr::Remove(ldLen);
    this_local._7_1_ = 0;
    goto LAB_0079b406;
  }
  bVar3 = ShouldGenerateArrayFastPath(this,pOVar8,false,true,false);
  bVar4 = ValueType::IsUninitialized((ValueType *)((long)&labelHelper + 6));
  local_149 = true;
  if (!bVar4) {
    local_149 = ValueType::HasBeenString((ValueType *)((long)&labelHelper + 6));
  }
  if ((!bVar3) && (local_149 == false)) {
    this_local._7_1_ = 1;
    goto LAB_0079b406;
  }
  bVar4 = IR::Opnd::IsRegOpnd(pOVar8);
  if (bVar4) {
    symOpnd = (SymOpnd *)IR::Opnd::AsRegOpnd(pOVar8);
  }
  else {
    pSVar10 = IR::Opnd::AsSymOpnd(pOVar8);
    pPVar11 = Sym::AsPropertySym(pSVar10->m_sym);
    symOpnd = (SymOpnd *)IR::RegOpnd::New(pPVar11->m_stackSym,TyVar,this->m_func);
    IR::Instr::ReplaceSrc1(ldLen,(Opnd *)symOpnd);
  }
  bVar4 = ValueType::IsLikelyAnyOptimizedArray((ValueType *)((long)&labelHelper + 6));
  if (bVar4) {
    local_150 = GetArrayOffsetOfLength((ValueType)labelHelper._6_2_);
  }
  else {
    local_150 = Js::ArrayObject::GetOffsetOfLength();
  }
  arrayOpnd = (RegOpnd *)0x0;
  arrayLengthOpnd = (RegOpnd *)symOpnd;
  autoReuseArrayLengthOpnd.autoDelete = false;
  autoReuseArrayLengthOpnd.wasInUse = false;
  autoReuseArrayLengthOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_a8);
  if (bVar3) {
    bVar4 = ValueType::IsAnyOptimizedArray((ValueType *)((long)&labelHelper + 6));
    if (bVar4) {
      bVar4 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)symOpnd);
      if (bVar4) {
        autoReuseArrayOpnd._16_8_ = IR::RegOpnd::AsArrayRegOpnd((RegOpnd *)symOpnd);
        pSVar12 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)autoReuseArrayOpnd._16_8_);
        if (pSVar12 != (StackSym *)0x0) {
          pSVar12 = IR::ArrayRegOpnd::LengthSym((ArrayRegOpnd *)autoReuseArrayOpnd._16_8_);
          autoReuseArrayLengthOpnd._16_8_ = IR::RegOpnd::New(pSVar12,TyUint32,this->m_func);
          IR::RegOpnd::FreezeSymValue((RegOpnd *)autoReuseArrayLengthOpnd._16_8_);
          IR::AutoReuseOpnd::Initialize
                    ((AutoReuseOpnd *)local_a8,(Opnd *)autoReuseArrayLengthOpnd._16_8_,this->m_func,
                     true);
        }
      }
    }
    else {
      local_178 = pLVar9;
      if (local_149 != false) {
        arrayOpnd = (RegOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
        local_178 = (LabelInstr *)arrayOpnd;
      }
      arrayLengthOpnd =
           GenerateArrayTest(this,(RegOpnd *)symOpnd,pLVar9,local_178,ldLen,false,false,false);
    }
  }
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&lengthOpnd,&arrayLengthOpnd->super_Opnd,this->m_func,true);
  autoReuseLengthOpnd.autoDelete = false;
  autoReuseLengthOpnd.wasInUse = false;
  autoReuseLengthOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd);
  indirOpnd = (IndirOpnd *)&autoReuseLengthOpnd.autoDelete;
  EnsureLengthOpnd.this = (Lowerer *)&EnsureLengthOpnd.autoReuseLengthOpnd;
  EnsureLengthOpnd.lengthOpnd = (RegOpnd **)this;
  if (bVar3) {
    if (autoReuseArrayLengthOpnd._16_8_ == 0) {
      GenerateFastLdLen::anon_class_24_3_5980dfa8::operator()
                ((anon_class_24_3_5980dfa8 *)&indirOpnd);
      pIVar13 = IR::IndirOpnd::New(arrayLengthOpnd,local_150,TyUint32,this->m_func,false);
      InsertMove((Opnd *)autoReuseLengthOpnd._16_8_,&pIVar13->super_Opnd,ldLen,true);
    }
    else {
      autoReuseLengthOpnd.autoDelete = autoReuseArrayLengthOpnd.autoDelete;
      autoReuseLengthOpnd.wasInUse = autoReuseArrayLengthOpnd.wasInUse;
      autoReuseLengthOpnd._18_6_ = autoReuseArrayLengthOpnd._18_6_;
      IR::AutoReuseOpnd::Initialize
                ((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd,
                 (Opnd *)autoReuseArrayLengthOpnd._16_8_,this->m_func,true);
      if (local_149 != false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x4c92,"(!stringFastPath)","!stringFastPath");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  if (local_149 != false) {
    indirOpnd_1 = (IndirOpnd *)0x0;
    if (bVar3) {
      indirOpnd_1 = (IndirOpnd *)IR::LabelInstr::New(Label,this->m_func,false);
      InsertBranch(Br,(LabelInstr *)indirOpnd_1,ldLen);
      IR::Instr::InsertBefore(ldLen,(Instr *)arrayOpnd);
    }
    GenerateStringTest(this,(RegOpnd *)symOpnd,ldLen,pLVar9,(LabelInstr *)0x0,(bool)(~bVar3 & 1));
    GenerateFastLdLen::anon_class_24_3_5980dfa8::operator()((anon_class_24_3_5980dfa8 *)&indirOpnd);
    pIVar13 = IR::IndirOpnd::New((RegOpnd *)symOpnd,0x18,TyUint32,this->m_func,false);
    InsertMove((Opnd *)autoReuseLengthOpnd._16_8_,&pIVar13->super_Opnd,ldLen,true);
    if (bVar3) {
      IR::Instr::InsertBefore(ldLen,(Instr *)indirOpnd_1);
    }
  }
  if (autoReuseLengthOpnd._16_8_ == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4cba,"(lengthOpnd)","lengthOpnd");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IR::Instr::HasBailOutInfo(ldLen);
  if (bVar3) {
    BVar6 = IR::Instr::GetBailOutKind(ldLen);
    e1 = IR::operator~(BailOutKindBits);
    BVar6 = IR::operator&(BVar6,e1);
    if (BVar6 != BailOutOnIrregularLength) goto LAB_0079b1e5;
    BVar6 = IR::Instr::GetBailOutKind(ldLen);
    if ((BVar6 != BailOutOnIrregularLength) && (bVar3 = IR::Instr::HasLazyBailOut(ldLen), !bVar3)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbe,
                         "(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut())"
                         ,
                         "ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut()"
                        );
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    bVar3 = IR::Opnd::IsInt32(&pRStack_40->super_Opnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cbf,"(dst->IsInt32())","dst->IsInt32()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar2 = autoReuseLengthOpnd._16_8_;
    IVar5 = IR::Opnd::GetType((Opnd *)autoReuseLengthOpnd._16_8_);
    pIVar14 = IR::IntConstOpnd::New(0,IVar5,this->m_func,true);
    InsertCompareBranch(this,(Opnd *)uVar2,&pIVar14->super_Opnd,BrLt_A,pLVar9,ldLen,false);
    InsertMove(&pRStack_40->super_Opnd,(Opnd *)autoReuseLengthOpnd._16_8_,ldLen,true);
    pLVar15 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    InsertBranch(Br,pLVar15,ldLen);
    IR::Instr::InsertBefore(ldLen,&pLVar9->super_Instr);
    *instrIsInHelperBlockRef = true;
    IR::Instr::FreeDst(ldLen);
    IR::Instr::FreeSrc1(ldLen);
    GenerateBailOut(this,ldLen,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
    this_local._7_1_ = 0;
    bVar3 = true;
  }
  else {
LAB_0079b1e5:
    uVar2 = autoReuseLengthOpnd._16_8_;
    IVar5 = IR::Opnd::GetType((Opnd *)autoReuseLengthOpnd._16_8_);
    pIVar14 = IR::IntConstOpnd::New(0,IVar5,this->m_func,true);
    InsertCompareBranch(this,(Opnd *)uVar2,&pIVar14->super_Opnd,BrLt_A,pLVar9,ldLen,false);
    IVar5 = IR::Opnd::GetType(&pRStack_40->super_Opnd);
    if (IVar5 != TyVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x4cf5,"(dst->GetType() == TyVar)","dst->GetType() == TyVar");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pOVar8 = IR::Opnd::Copy(&pRStack_40->super_Opnd,this->m_func);
    IR::Opnd::SetType(pOVar8,TyInt32);
    InsertMove(pOVar8,(Opnd *)autoReuseLengthOpnd._16_8_,ldLen,true);
    LowererMD::GenerateInt32ToVarConversion(&this->m_lowererMD,&pRStack_40->super_Opnd,ldLen);
    pLVar15 = IR::Instr::GetOrCreateContinueLabel(ldLen,false);
    InsertBranch(Br,pLVar15,ldLen);
    bVar3 = false;
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureLengthOpnd.autoReuseLengthOpnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&lengthOpnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_a8);
  if (!bVar3) {
    IR::Instr::InsertBefore(ldLen,&pLVar9->super_Instr);
    *instrIsInHelperBlockRef = true;
    this_local._7_1_ = 1;
  }
LAB_0079b406:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Lowerer::GenerateFastLdLen(IR::Instr *ldLen, bool *instrIsInHelperBlockRef)
{
    Assert(instrIsInHelperBlockRef);
    bool &instrIsInHelperBlock = *instrIsInHelperBlockRef;
    instrIsInHelperBlock = false;

    //     TEST src, AtomTag                  -- check src not tagged int
    //     JNE $helper
    //     CMP [src], JavascriptArray::`vtable' -- check base isArray
    //     JNE $string
    //     MOV length, [src + offset(length)]     -- Load array length
    //     JMP $tovar
    // $string:
    //     CMP [src + offset(type)], static_string_type -- check src isString
    //     JNE $helper
    //     MOV length, [src + offset(length)]     -- Load string length
    // $toVar:
    //     TEST length, 0xC0000000       -- test for overflow of SHL, or negative
    //     JNE $helper
    //     SHL length, Js::VarTag_Shift  -- restore the var tag on the result
    //     INC length
    //     MOV dst, length
    //     JMP $fallthru
    // $helper:
    //     CALL GetProperty(src, length_property_id, scriptContext)
    // $fallthru:

    IR::Opnd *          opnd = ldLen->GetSrc1();
    IR::RegOpnd *       dst = ldLen->GetDst()->AsRegOpnd();
    const ValueType     srcValueType(opnd->GetValueType());

    IR::LabelInstr *const labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (ldLen->DoStackArgsOpt())
    {
        GenerateFastArgumentsLdLen(ldLen, ldLen->GetOrCreateContinueLabel());
        ldLen->Remove();
        return false;
    }
    else
    {
        const bool arrayFastPath = ShouldGenerateArrayFastPath(opnd, false, true, false);

        // HasBeenString instead of IsLikelyString because it could be a merge between StringObject and String, and this
        // information about whether it's a StringObject or some other object is not available in the profile data
        const bool stringFastPath = srcValueType.IsUninitialized() || srcValueType.HasBeenString();

        if(!(arrayFastPath || stringFastPath))
        {
            return true;
        }

        IR::RegOpnd * src;
        if (opnd->IsRegOpnd())
        {
            src = opnd->AsRegOpnd();
        }
        else
        {
            // LdLen has a PropertySymOpnd until globopt where the decision whether to convert it to LdFld is made. If globopt is skipped, the opnd will
            // still be a PropertySymOpnd here. In that case, do the conversion here.
            IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
            PropertySym * propertySym = symOpnd->m_sym->AsPropertySym();
            src = IR::RegOpnd::New(propertySym->m_stackSym, IRType::TyVar, this->m_func);
            ldLen->ReplaceSrc1(src);
            opnd = src;
        }

        const int32 arrayOffsetOfLength =
            srcValueType.IsLikelyAnyOptimizedArray()
                ? GetArrayOffsetOfLength(srcValueType)
                : Js::JavascriptArray::GetOffsetOfLength();
        IR::LabelInstr *labelString = nullptr;
        IR::RegOpnd *arrayOpnd = src;
        IR::RegOpnd *arrayLengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseArrayLengthOpnd;
        if(arrayFastPath)
        {
            if(!srcValueType.IsAnyOptimizedArray())
            {
                if(stringFastPath)
                {
                    // If we don't have info about the src value type or its object type, the array and string fast paths are
                    // generated
                    labelString = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                }

                arrayOpnd = GenerateArrayTest(src, labelHelper, stringFastPath ? labelString : labelHelper, ldLen, false);
            }
            else if(src->IsArrayRegOpnd())
            {
                IR::ArrayRegOpnd *const arrayRegOpnd = src->AsArrayRegOpnd();
                if(arrayRegOpnd->LengthSym())
                {
                    arrayLengthOpnd = IR::RegOpnd::New(arrayRegOpnd->LengthSym(), TyUint32, m_func);
                    DebugOnly(arrayLengthOpnd->FreezeSymValue());
                    autoReuseArrayLengthOpnd.Initialize(arrayLengthOpnd, m_func);
                }
            }
        }
        const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, m_func);

        IR::RegOpnd *lengthOpnd = nullptr;
        IR::AutoReuseOpnd autoReuseLengthOpnd;
        const auto EnsureLengthOpnd = [&]()
        {
            if(lengthOpnd)
            {
                return;
            }

            lengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
            autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
        };

        if(arrayFastPath)
        {
            if(arrayLengthOpnd)
            {
                lengthOpnd = arrayLengthOpnd;
                autoReuseLengthOpnd.Initialize(lengthOpnd, m_func);
                Assert(!stringFastPath);
            }
            else
            {
                //     MOV length, [array + offset(length)]     -- Load array length
                EnsureLengthOpnd();
                IR::IndirOpnd *const indirOpnd = IR::IndirOpnd::New(arrayOpnd, arrayOffsetOfLength, TyUint32, this->m_func);
                InsertMove(lengthOpnd, indirOpnd, ldLen);
            }
        }

        if(stringFastPath)
        {
            IR::LabelInstr *labelToVar = nullptr;
            if(arrayFastPath)
            {
                //     JMP $tovar
                labelToVar = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
                InsertBranch(Js::OpCode::Br, labelToVar, ldLen);

                // $string:
                ldLen->InsertBefore(labelString);
            }

            //  CMP [src + offset(type)], static_stringtype -- check src isString
            //  JNE $helper
            GenerateStringTest(src, ldLen, labelHelper, nullptr, !arrayFastPath);

            //  MOV length, [src + offset(length)]     -- Load string length
            EnsureLengthOpnd();
            IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(src, offsetof(Js::JavascriptString, m_charLength), TyUint32, this->m_func);
            InsertMove(lengthOpnd, indirOpnd, ldLen);

            if(arrayFastPath)
            {
                // $toVar:
                ldLen->InsertBefore(labelToVar);
            }
        }

        Assert(lengthOpnd);

        if(ldLen->HasBailOutInfo() && (ldLen->GetBailOutKind() & ~IR::BailOutKindBits) == IR::BailOutOnIrregularLength)
        {
            Assert(ldLen->GetBailOutKind() == IR::BailOutOnIrregularLength || ldLen->HasLazyBailOut());
            Assert(dst->IsInt32());

            // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
            //     test length, length
            //     js $helper
            //     mov dst, length
            //     jmp $fallthrough
            InsertCompareBranch(
                lengthOpnd,
                IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
                Js::OpCode::BrLt_A,
                labelHelper,
                ldLen);
            InsertMove(dst, lengthOpnd, ldLen);
            InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);

            // $helper:
            //     (Bail out with IR::BailOutOnIrregularLength)
            ldLen->InsertBefore(labelHelper);
            instrIsInHelperBlock = true;
            ldLen->FreeDst();
            ldLen->FreeSrc1();
            GenerateBailOut(ldLen);
            return false;
        }

    #if INT32VAR
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative
        //     test length, length
        //     js $helper
        InsertCompareBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0, lengthOpnd->GetType(), m_func, true),
            Js::OpCode::BrLt_A,
            labelHelper,
            ldLen);
    #else
        // Since the length is an unsigned int32, verify that when interpreted as a signed int32, it is not negative.
        // Additionally, verify that the signed value's width is not greater than 31 bits, since it needs to be tagged.
        //     test length, 0xC0000000
        //     jne $helper
        InsertTestBranch(
            lengthOpnd,
            IR::IntConstOpnd::New(0xC0000000, TyUint32, this->m_func, true),
            Js::OpCode::BrNeq_A,
            labelHelper,
            ldLen);
    #endif

    #if INT32VAR
        //
        // dst_32 = MOV length
        // dst_64 = OR dst_64, Js::AtomTag_IntPtr
        //
        Assert(dst->GetType() == TyVar);

        IR::Opnd *dst32 = dst->Copy(this->m_func);
        dst32->SetType(TyInt32);

        // This will clear the top bits.
        InsertMove(dst32, lengthOpnd, ldLen);

        m_lowererMD.GenerateInt32ToVarConversion(dst, ldLen);
    #else
        // dst = SHL length, Js::VarTag_Shift  -- restore the var tag on the result
        InsertShift(
            Js::OpCode::Shl_A,
            false /* needFlags */,
            dst,
            lengthOpnd,
            IR::IntConstOpnd::New(Js::VarTag_Shift, TyInt8, this->m_func),
            ldLen);

        // dst = ADD dst, AtomTag
        InsertAdd(
            false /* needFlags */,
            dst,
            dst,
            IR::IntConstOpnd::New(Js::AtomTag_Int32, TyUint32, m_func, true),
            ldLen);
    #endif

        //  JMP $fallthrough
        InsertBranch(Js::OpCode::Br, ldLen->GetOrCreateContinueLabel(), ldLen);
    }

    // $helper:
    //      (caller generates helper call)
    ldLen->InsertBefore(labelHelper);
    instrIsInHelperBlock = true;

    return true; // fast path was generated, helper call will be in a helper block
}